

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O0

void bloomfilter::applyBlock(uint32_t *tmp,int block,int len,uint64_t *data)

{
  uint32_t index_00;
  uint64_t uVar1;
  long in_RCX;
  ulong uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t index;
  int i;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    index_00 = *(uint32_t *)(in_RDI + (long)(in_ESI * 0x8000 + local_1c) * 4);
    uVar1 = getBit(index_00);
    uVar2 = (ulong)(index_00 >> 6);
    *(uint64_t *)(in_RCX + uVar2 * 8) = uVar1 | *(ulong *)(in_RCX + uVar2 * 8);
  }
  return;
}

Assistant:

void applyBlock(uint32_t *tmp, int block, int len, uint64_t *data) {
  for (int i = 0; i < len; i++) {
    uint32_t index = tmp[(block << blockShift) + i];
    data[index >> 6] |= getBit(index);
  }
}